

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_byte_array_stop_decode_block
              (cram_slice *slice,cram_codec *c,cram_block *in,char *out_,int *out_size)

{
  undefined8 uVar1;
  uchar uVar2;
  uchar *__src;
  uchar *puVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double local_88;
  double local_80;
  char *cp_start;
  int i;
  char stop;
  char *cp_end;
  char *out_cp;
  char *cp;
  cram_block *out;
  cram_block *b;
  int *out_size_local;
  char *out__local;
  cram_block *in_local;
  cram_codec *c_local;
  cram_slice *slice_local;
  
  out = (cram_block *)0x0;
  if (slice->block_by_id == (cram_block **)0x0) {
    cp_start._0_4_ = 0;
    while (((int)cp_start < slice->hdr->num_blocks &&
           (((out = slice->block[(int)cp_start], out == (cram_block *)0x0 ||
             (out->content_type != EXTERNAL)) || (out->content_id != (c->field_6).external.type)))))
    {
      cp_start._0_4_ = (int)cp_start + 1;
    }
    if (((int)cp_start == slice->hdr->num_blocks) || (out == (cram_block *)0x0)) {
      return -1;
    }
  }
  else {
    out = slice->block_by_id[(c->field_6).beta.nbits];
    if (out == (cram_block *)0x0) {
      if (*out_size == 0) {
        return 0;
      }
      return -1;
    }
  }
  if (out->idx < out->uncomp_size) {
    __src = out->data + out->idx;
    puVar3 = out->data + out->uncomp_size;
    cp_end = (char *)(*(long *)(out_ + 0x20) + *(long *)(out_ + 0x30));
    uVar2 = (c->field_6).byte_array_stop.stop;
    out_cp = (char *)__src;
    if ((ulong)((long)puVar3 - (long)__src) <
        (ulong)(*(long *)(out_ + 0x28) - *(long *)(out_ + 0x30))) {
      while (*out_cp != uVar2 && (uchar *)out_cp != puVar3) {
        *cp_end = *out_cp;
        cp_end = cp_end + 1;
        out_cp = out_cp + 1;
      }
      *(long *)(out_ + 0x30) = (long)cp_end - *(long *)(out_ + 0x20);
    }
    else {
      for (; *out_cp != uVar2 && (uchar *)out_cp != puVar3; out_cp = out_cp + 1) {
      }
      while (*(char **)(out_ + 0x28) <= out_cp + (*(long *)(out_ + 0x30) - (long)__src)) {
        if (*(long *)(out_ + 0x28) == 0) {
          local_80 = 1024.0;
        }
        else {
          uVar1 = *(undefined8 *)(out_ + 0x28);
          auVar5._8_4_ = (int)((ulong)uVar1 >> 0x20);
          auVar5._0_8_ = uVar1;
          auVar5._12_4_ = 0x45300000;
          local_80 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.5;
        }
        *(long *)(out_ + 0x28) =
             (long)local_80 | (long)(local_80 - 9.223372036854776e+18) & (long)local_80 >> 0x3f;
        pvVar4 = realloc(*(void **)(out_ + 0x20),*(size_t *)(out_ + 0x28));
        *(void **)(out_ + 0x20) = pvVar4;
      }
      memcpy((void *)(*(long *)(out_ + 0x20) + *(long *)(out_ + 0x30)),__src,
             (long)out_cp - (long)__src);
      *(char **)(out_ + 0x30) = out_cp + (*(long *)(out_ + 0x30) - (long)__src);
      while (*(char **)(out_ + 0x28) <= out_cp + (*(long *)(out_ + 0x30) - (long)__src)) {
        if (*(long *)(out_ + 0x28) == 0) {
          local_88 = 1024.0;
        }
        else {
          uVar1 = *(undefined8 *)(out_ + 0x28);
          auVar6._8_4_ = (int)((ulong)uVar1 >> 0x20);
          auVar6._0_8_ = uVar1;
          auVar6._12_4_ = 0x45300000;
          local_88 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.5;
        }
        *(long *)(out_ + 0x28) =
             (long)local_88 | (long)(local_88 - 9.223372036854776e+18) & (long)local_88 >> 0x3f;
        pvVar4 = realloc(*(void **)(out_ + 0x20),*(size_t *)(out_ + 0x28));
        *(void **)(out_ + 0x20) = pvVar4;
      }
    }
    *out_size = (int)out_cp - ((int)out->data + out->idx);
    out->idx = ((int)out_cp - (int)out->data) + 1;
    slice_local._4_4_ = 0;
  }
  else {
    slice_local._4_4_ = -1;
  }
  return slice_local._4_4_;
}

Assistant:

int cram_byte_array_stop_decode_block(cram_slice *slice, cram_codec *c,
				      cram_block *in, char *out_,
				      int *out_size) {
    cram_block *b = NULL;
    cram_block *out = (cram_block *)out_;
    char *cp, *out_cp, *cp_end;
    char stop;

    if (slice->block_by_id) {
	if (!(b = slice->block_by_id[c->byte_array_stop.content_id]))
	    return *out_size?-1:0;
    } else {
	int i;
	for (i = 0; i < slice->hdr->num_blocks; i++) {
	    b = slice->block[i];
	    if (b && b->content_type == EXTERNAL &&
		b->content_id == c->byte_array_stop.content_id) {
		break;
	    }
	}
	if (i == slice->hdr->num_blocks || !b)
	    return -1;
    }

    if (b->idx >= b->uncomp_size)
	return -1;
    cp = (char *)b->data + b->idx;
    cp_end = (char *)b->data + b->uncomp_size;
    out_cp = (char *)BLOCK_END(out);

    stop = c->byte_array_stop.stop;
    if (cp_end - cp < out->alloc - out->byte) {
	while (*cp != stop && cp != cp_end)
	    *out_cp++ = *cp++;
	BLOCK_SIZE(out) = out_cp - (char *)BLOCK_DATA(out);
    } else {
	char *cp_start;
	for (cp_start = cp; *cp != stop && cp != cp_end; cp++)
	    ;
	BLOCK_APPEND(out, cp_start, cp - cp_start);
	BLOCK_GROW(out, cp - cp_start);
    }

    *out_size = cp - (char *)(b->data + b->idx);
    b->idx = cp - (char *)b->data + 1;

    return 0;
}